

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derOIDEnc(octet *der,char *oid)

{
  bool_t bVar1;
  u32 tag;
  octet *der_00;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  size_t count;
  size_t pos;
  u32 val;
  u32 d1;
  octet *local_38;
  size_t len;
  void *val_00;
  u32 local_20;
  size_t local_8;
  
  local_20 = 0;
  val_00 = (void *)0x0;
  len = 0;
  bVar1 = oidIsValid((char *)0x0);
  if (bVar1 == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    tag = (int)*in_RSI - 0x30;
    der_00 = (octet *)(in_RSI + 2);
    while( true ) {
      for (; (der_00[(long)val_00] != '.' && (der_00[(long)val_00] != '\0'));
          val_00 = (void *)((long)val_00 + 1)) {
        local_20 = (char)der_00[(long)val_00] + -0x30 + local_20 * 10;
      }
      if (tag != 3) {
        local_20 = tag * 0x28 + local_20;
        tag = 3;
      }
      if (in_RDI == 0) {
        local_38 = (octet *)0x0;
      }
      else {
        local_38 = (octet *)(in_RDI + len);
      }
      sVar2 = derSIDEnc(local_38,local_20);
      len = sVar2 + len;
      if (der_00[(long)val_00] == '\0') break;
      der_00 = der_00 + (long)val_00 + 1;
      val_00 = (void *)0x0;
      local_20 = 0;
    }
    local_8 = derEnc(der_00,tag,val_00,len);
  }
  return local_8;
}

Assistant:

size_t derOIDEnc(octet der[], const char* oid)
{
	u32 d1;
	u32 val = 0;
	size_t pos = 0;
	size_t count = 0;
	// корректен?
	if (!oidIsValid(oid))
		return SIZE_MAX;
	// pre
	ASSERT(oid[0] == '0' || oid[0] == '1' || oid[0] == '2');
	ASSERT(oid[1] == '.');
	// обработать d1
	d1 = oid[0] - '0';
	oid += 2;
	// цикл по символам oid
	while (1)
	{
		// закончили очередное число?
		if (oid[pos] == '.' || oid[pos] == '\0')
		{
			// закончили d2?
			if (d1 != 3)
				val += 40 * d1, d1 = 3;
			// обработать число
			count += derSIDEnc(der ? der + count : der, val);
			// конец строки?
			if (oid[pos] == '\0')
				break;
			// к следующему числу
			oid += ++pos, pos = 0, val = 0;
				continue;
		}
		// обработать цифру
		val *= 10;
		val += oid[pos] - '0';
		++pos;
	}
	// кодировать TL
	count = derEnc(der, 0x06, der, count);
	// очистка и выход
	d1 = val = 0, pos = 0;
	return count;
}